

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Camera::readFrom(Camera *this,BinaryReader *binary)

{
  BinaryReader::read<float,void>(binary,&this->fov);
  BinaryReader::read<float,void>(binary,&this->focalDistance);
  BinaryReader::read<float,void>(binary,&this->lensRadius);
  BinaryReader::read<pbrt::math::affine3f,void>(binary,&this->frame);
  BinaryReader::read<pbrt::Camera::_unnamed_type_1_,void>(binary,&this->simplified);
  return;
}

Assistant:

void Camera::readFrom(BinaryReader &binary) 
  {
    binary.read(fov);
    binary.read(focalDistance);
    binary.read(lensRadius);
    binary.read(frame);
    binary.read(simplified);
  }